

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

void jsonErrorFunc(sqlite3_context *ctx,int argc,sqlite3_value **argv)

{
  Mem *pMem;
  int iVar1;
  u32 uVar2;
  long lVar3;
  ulong val;
  long lVar4;
  long in_FS_OFFSET;
  JsonParse s;
  JsonParse local_68;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  local_68.aBlob = (u8 *)0x0;
  local_68.nBlob = 0;
  local_68.nBlobAlloc = 0;
  local_68.zJson = (char *)0x0;
  local_68.nJson = 0;
  local_68.nJPRef = 0;
  local_68.iErr = 0;
  local_68.iDepth = 0;
  local_68.nErr = '\0';
  local_68.oom = '\0';
  local_68.bJsonIsRCStr = '\0';
  local_68.hasNonstd = '\0';
  local_68.bReadOnly = '\0';
  local_68.eEdit = '\0';
  local_68.delta = 0;
  local_68.nIns = 0;
  local_68.iLabel = 0;
  local_68.aIns = (u8 *)0x0;
  local_68.db = ctx->pOut->db;
  iVar1 = jsonFuncArgMightBeBinary(*argv);
  if (iVar1 == 0) {
    local_68.zJson = (char *)sqlite3ValueText(*argv,'\x01');
    if (local_68.zJson == (char *)0x0) goto LAB_001b8d95;
    iVar1 = sqlite3ValueBytes(*argv,'\x01');
    local_68.nJson = iVar1;
    val = 0;
    iVar1 = jsonConvertTextToBlob(&local_68,(sqlite3_context *)0x0);
    if ((iVar1 != 0) && (val = 0xffffffffffffffff, local_68.oom == '\0')) {
      if (local_68.iErr == 0) {
        val = 1;
      }
      else {
        lVar3 = 0;
        lVar4 = 0;
        do {
          if (local_68.zJson[lVar3] == '\0') break;
          lVar4 = lVar4 + 1;
          lVar3 = lVar3 + 1;
        } while (local_68.iErr != (u32)lVar3);
        val = lVar4 + 1;
      }
    }
  }
  else {
    local_68.aBlob = (u8 *)sqlite3_value_blob(*argv);
    uVar2 = sqlite3ValueBytes(*argv,'\x01');
    local_68.nBlob = uVar2;
    uVar2 = jsonbValidityCheck(&local_68,0,uVar2,1);
    val = (ulong)uVar2;
  }
  jsonParseReset(&local_68);
  if ((long)val < 0) {
    sqlite3_result_error_nomem(ctx);
  }
  else {
    pMem = ctx->pOut;
    if ((pMem->flags & 0x9000) == 0) {
      (pMem->u).i = val;
      pMem->flags = 4;
    }
    else {
      vdbeReleaseAndSetInt64(pMem,val);
    }
  }
LAB_001b8d95:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

static void jsonErrorFunc(
  sqlite3_context *ctx,
  int argc,
  sqlite3_value **argv
){
  i64 iErrPos = 0;       /* Error position to be returned */
  JsonParse s;

  assert( argc==1 );
  UNUSED_PARAMETER(argc);
  memset(&s, 0, sizeof(s));
  s.db = sqlite3_context_db_handle(ctx);
  if( jsonFuncArgMightBeBinary(argv[0]) ){
    s.aBlob = (u8*)sqlite3_value_blob(argv[0]);
    s.nBlob = sqlite3_value_bytes(argv[0]);
    iErrPos = (i64)jsonbValidityCheck(&s, 0, s.nBlob, 1);
  }else{
    s.zJson = (char*)sqlite3_value_text(argv[0]);
    if( s.zJson==0 ) return;  /* NULL input or OOM */
    s.nJson = sqlite3_value_bytes(argv[0]);
    if( jsonConvertTextToBlob(&s,0) ){
      if( s.oom ){
        iErrPos = -1;
      }else{
        /* Convert byte-offset s.iErr into a character offset */
        u32 k;
        assert( s.zJson!=0 );  /* Because s.oom is false */
        for(k=0; k<s.iErr && ALWAYS(s.zJson[k]); k++){
          if( (s.zJson[k] & 0xc0)!=0x80 ) iErrPos++;
        }
        iErrPos++;
      }
    }
  }
  jsonParseReset(&s);
  if( iErrPos<0 ){
    sqlite3_result_error_nomem(ctx);
  }else{
    sqlite3_result_int64(ctx, iErrPos);
  }
}